

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O3

TokenType __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
checkIntLiteralRange
          (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           *this,bool isNegative)

{
  char *__s1;
  int iVar1;
  CompileMessage local_50;
  
  __s1 = (this->literalType).text;
  if (__s1 != "$integer32") {
    if (__s1 == (char *)0x0) goto LAB_001eb06c;
    iVar1 = strcmp(__s1,"$integer32");
    if (iVar1 != 0) goto LAB_001eb06c;
  }
  if (isNegative) {
    if (this->literalIntValue < 0x80000001) goto LAB_001eb06c;
    CompileMessageHelpers::createMessage<>
              (&local_50,syntax,error,
               "This value is too large to fit into an int32, did you mean to add an \'i64\' suffix?"
              );
    (*this->_vptr_Tokeniser[2])(this,&local_50);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_50.location.sourceCode.object);
  }
  else {
    if (this->literalIntValue < 0x80000000) goto LAB_001eb06c;
    CompileMessageHelpers::createMessage<>
              (&local_50,syntax,error,
               "This value is too large to fit into an int32, did you mean to add an \'i64\' suffix?"
              );
    (*this->_vptr_Tokeniser[2])(this,&local_50);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_50.location.sourceCode.object);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.description._M_dataplus._M_p != &local_50.description.field_2) {
    operator_delete(local_50.description._M_dataplus._M_p,
                    local_50.description.field_2._M_allocated_capacity + 1);
  }
LAB_001eb06c:
  return (TokenType)(this->literalType).text;
}

Assistant:

TokenType checkIntLiteralRange (bool isNegative)
    {
        if (literalType == Token::literalInt32)
        {
            if (isNegative && literalIntValue > -static_cast<int64_t> (std::numeric_limits<int32_t>::min()))
                throwError (Errors::integerLiteralNeedsSuffix());

            if (! isNegative && literalIntValue > static_cast<int64_t> (std::numeric_limits<int32_t>::max()))
                throwError (Errors::integerLiteralNeedsSuffix());
        }

        return literalType;
    }